

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullTransport.cpp
# Opt level: O1

void __thiscall adios2::transport::NullTransport::Seek(NullTransport *this,size_t start)

{
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (((this->Impl)._M_t.
       super___uniq_ptr_impl<adios2::transport::NullTransport::NullTransportImpl,_std::default_delete<adios2::transport::NullTransport::NullTransportImpl>_>
       ._M_t.
       super__Tuple_impl<0UL,_adios2::transport::NullTransport::NullTransportImpl_*,_std::default_delete<adios2::transport::NullTransport::NullTransportImpl>_>
       .super__Head_base<0UL,_adios2::transport::NullTransport::NullTransportImpl_*,_false>.
      _M_head_impl)->IsOpen == false) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Toolkit","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"transport::NullTransport","");
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Seek","");
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"transport is not open yet","");
    helper::Throw<std::runtime_error>(&local_50,&local_70,&local_90,&local_b0,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  ((this->Impl)._M_t.
   super___uniq_ptr_impl<adios2::transport::NullTransport::NullTransportImpl,_std::default_delete<adios2::transport::NullTransport::NullTransportImpl>_>
   ._M_t.
   super__Tuple_impl<0UL,_adios2::transport::NullTransport::NullTransportImpl_*,_std::default_delete<adios2::transport::NullTransport::NullTransportImpl>_>
   .super__Head_base<0UL,_adios2::transport::NullTransport::NullTransportImpl_*,_false>._M_head_impl
  )->CurPos = start;
  return;
}

Assistant:

void NullTransport::Seek(const size_t start)
{
    if (!Impl->IsOpen)
    {
        helper::Throw<std::runtime_error>("Toolkit", "transport::NullTransport", "Seek",
                                          "transport is not open yet");
    }
    Impl->CurPos = start;
}